

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t hufBuildDecTable(uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  bool bVar1;
  int32_t *piVar2;
  exr_result_t eVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  HufDec *pHVar11;
  ulong uVar12;
  exr_result_t unaff_R13D;
  uint32_t *p;
  bool bVar13;
  
  if (iM < im) {
    return 0;
  }
  uVar12 = (ulong)im;
  do {
    uVar8 = hcode[uVar12];
    uVar9 = uVar8 >> 6;
    eVar3 = 0x17;
    bVar1 = true;
    if (uVar9 >> ((byte)uVar8 & 0x3f) == 0) {
      uVar7 = (uint)uVar8 & 0x3f;
      if (uVar7 < 0xf) {
        if ((uVar8 & 0x3f) != 0) {
          bVar6 = 0xe - (char)uVar7;
          lVar10 = uVar9 << (bVar6 & 0x3f);
          if (hdecod[lVar10].len == 0) {
            uVar8 = (ulong)(uint)(1 << (bVar6 & 0x1f));
            pHVar11 = hdecod + lVar10 + 1;
            bVar13 = false;
            do {
              if (pHVar11[-1].p != (uint32_t *)0x0) break;
              pHVar11[-1].len = uVar7;
              pHVar11[-1].lit = (uint32_t)uVar12;
              uVar8 = uVar8 - 1;
              bVar13 = uVar8 == 0;
              if (bVar13) {
                bVar1 = false;
                eVar3 = unaff_R13D;
                break;
              }
              piVar2 = &pHVar11->len;
              pHVar11 = pHVar11 + 1;
            } while (*piVar2 == 0);
          }
          else {
            bVar13 = false;
          }
          goto joined_r0x00110c74;
        }
      }
      else {
        uVar9 = uVar9 >> ((char)uVar7 - 0xeU & 0x3f);
        if (hdecod[uVar9].len == 0) {
          uVar7 = hdecod[uVar9].lit + 1;
          hdecod[uVar9].lit = uVar7;
          puVar5 = hdecod[uVar9].p;
          if (puVar5 == (uint32_t *)0x0) {
            puVar5 = (uint32_t *)internal_exr_alloc(4);
            hdecod[uVar9].p = puVar5;
          }
          else {
            puVar4 = (uint32_t *)internal_exr_alloc((ulong)uVar7 << 2);
            hdecod[uVar9].p = puVar4;
            if ((puVar4 != (uint32_t *)0x0) && (uVar7 = hdecod[uVar9].lit - 1, uVar7 != 0)) {
              uVar8 = 0;
              do {
                puVar4[uVar8] = puVar5[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
            internal_exr_free(puVar5);
          }
          puVar5 = hdecod[uVar9].p;
          if (puVar5 == (uint32_t *)0x0) {
            unaff_R13D = 1;
          }
          else {
            puVar5[hdecod[uVar9].lit - 1] = (uint32_t)uVar12;
          }
          bVar13 = puVar5 != (uint32_t *)0x0;
        }
        else {
          unaff_R13D = 0x17;
          bVar13 = false;
        }
        bVar1 = true;
        eVar3 = unaff_R13D;
joined_r0x00110c74:
        unaff_R13D = eVar3;
        if (!bVar13) goto LAB_00110d3f;
      }
      eVar3 = unaff_R13D;
      bVar1 = false;
    }
LAB_00110d3f:
    if (bVar1) {
      return eVar3;
    }
    uVar12 = uVar12 + 1;
    unaff_R13D = eVar3;
    if (iM + 1 == (int)uVar12) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
hufBuildDecTable (
    const uint64_t* hcode, uint32_t im, uint32_t iM, HufDec* hdecod)
{
    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p       = (uint32_t*) internal_exr_alloc (
                    sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                internal_exr_free (p);
            }
            else { pl->p = (uint32_t*) internal_exr_alloc (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = 1 << (HUF_DECBITS - l); i > 0; i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}